

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

size_t Qiniu_Rd_Reader_Callback(char *buffer,size_t size,size_t nitems,void *userData)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = Qiniu_File_ReadAt(*userData,buffer,nitems * size,*(Qiniu_Off_T *)((long)userData + 8));
  if ((long)sVar2 < 0) {
    *(undefined4 *)((long)userData + 0x10) = 2;
LAB_00125477:
    sVar2 = 0x10000000;
  }
  else {
    if (*(code **)((long)userData + 0x20) != (code *)0x0) {
      iVar1 = (**(code **)((long)userData + 0x20))
                        (*(undefined8 *)((long)userData + 0x18),buffer,sVar2);
      if (iVar1 != 0) {
        *(undefined4 *)((long)userData + 0x10) = 1;
        goto LAB_00125477;
      }
    }
    *(long *)((long)userData + 8) = *(long *)((long)userData + 8) + sVar2;
  }
  return sVar2;
}

Assistant:

QINIU_DLLAPI size_t Qiniu_Rd_Reader_Callback(char * buffer, size_t size, size_t nitems, void * userData)
{
	ssize_t ret;
	Qiniu_Rd_Reader * rdr = (Qiniu_Rd_Reader *)userData;

	ret = Qiniu_File_ReadAt(rdr->file, buffer, size * nitems, rdr->offset);
	if (ret < 0) {
		rdr->status = QINIU_RD_ABORT_BY_READAT;
		return CURL_READFUNC_ABORT;
	} // if

	if (rdr->abortCallback && rdr->abortCallback(rdr->abortUserData, buffer, ret)) {
		rdr->status = QINIU_RD_ABORT_BY_CALLBACK;
		return CURL_READFUNC_ABORT;
	} // if

	rdr->offset += ret;
	return ret;
}